

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int UTF8Toisolat1(uchar *out,int *outlen,uchar *in,int *inlen)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  int *piVar7;
  int local_64;
  int trailing;
  uint d;
  uint c;
  uchar *inend;
  uchar *instart;
  uchar *outstart;
  uchar *outend;
  uchar *processed;
  int *inlen_local;
  uchar *in_local;
  int *outlen_local;
  uchar *out_local;
  
  if (((out == (uchar *)0x0) || (outlen == (int *)0x0)) || (inlen == (int *)0x0)) {
    out_local._4_4_ = -1;
  }
  else if (in == (uchar *)0x0) {
    *outlen = 0;
    *inlen = 0;
    out_local._4_4_ = 0;
  }
  else {
    piVar6 = (int *)(in + *inlen);
    iVar1 = *outlen;
    inlen_local = (int *)in;
    outlen_local = (int *)out;
    while( true ) {
      iVar2 = (int)outlen_local;
      iVar3 = (int)out;
      iVar4 = (int)inlen_local;
      iVar5 = (int)in;
      if (piVar6 <= inlen_local) break;
      piVar7 = (int *)((long)inlen_local + 1);
      trailing = (int)(byte)*inlen_local;
      if ((uint)trailing < 0x80) {
        local_64 = 0;
      }
      else {
        if ((uint)trailing < 0xc0) {
          *outlen = iVar2 - iVar3;
          *inlen = iVar4 - iVar5;
          return -2;
        }
        if ((uint)trailing < 0xe0) {
          trailing = trailing & 0x1f;
          local_64 = 1;
        }
        else if ((uint)trailing < 0xf0) {
          trailing = trailing & 0xf;
          local_64 = 2;
        }
        else {
          if (0xf7 < (uint)trailing) {
            *outlen = iVar2 - iVar3;
            *inlen = iVar4 - iVar5;
            return -2;
          }
          trailing = trailing & 7;
          local_64 = 3;
        }
      }
      inlen_local = piVar7;
      if ((long)piVar6 - (long)piVar7 < (long)local_64) break;
      while ((local_64 != 0 && (inlen_local < piVar6))) {
        if (((byte)*inlen_local & 0xc0) != 0x80) {
          *outlen = iVar2 - iVar3;
          *inlen = iVar4 - iVar5;
          return -2;
        }
        trailing = (byte)*inlen_local & 0x3f | trailing << 6;
        local_64 = local_64 + -1;
        inlen_local = (int *)((long)inlen_local + 1);
      }
      if (0xff < (uint)trailing) {
        *outlen = iVar2 - iVar3;
        *inlen = iVar4 - iVar5;
        return -2;
      }
      if (out + iVar1 <= outlen_local) break;
      *(char *)outlen_local = (char)trailing;
      outlen_local = (int *)((long)outlen_local + 1);
    }
    *outlen = iVar2 - iVar3;
    *inlen = iVar4 - iVar5;
    out_local._4_4_ = *outlen;
  }
  return out_local._4_4_;
}

Assistant:

int
UTF8Toisolat1(unsigned char* out, int *outlen,
              const unsigned char* in, int *inlen) {
    const unsigned char* processed = in;
    const unsigned char* outend;
    const unsigned char* outstart = out;
    const unsigned char* instart = in;
    const unsigned char* inend;
    unsigned int c, d;
    int trailing;

    if ((out == NULL) || (outlen == NULL) || (inlen == NULL)) return(-1);
    if (in == NULL) {
        /*
	 * initialization nothing to do
	 */
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    inend = in + (*inlen);
    outend = out + (*outlen);
    while (in < inend) {
	d = *in++;
	if      (d < 0x80)  { c= d; trailing= 0; }
	else if (d < 0xC0) {
	    /* trailing byte in leading position */
	    *outlen = out - outstart;
	    *inlen = processed - instart;
	    return(-2);
        } else if (d < 0xE0)  { c= d & 0x1F; trailing= 1; }
        else if (d < 0xF0)  { c= d & 0x0F; trailing= 2; }
        else if (d < 0xF8)  { c= d & 0x07; trailing= 3; }
	else {
	    /* no chance for this in IsoLat1 */
	    *outlen = out - outstart;
	    *inlen = processed - instart;
	    return(-2);
	}

	if (inend - in < trailing) {
	    break;
	}

	for ( ; trailing; trailing--) {
	    if (in >= inend)
		break;
	    if (((d= *in++) & 0xC0) != 0x80) {
		*outlen = out - outstart;
		*inlen = processed - instart;
		return(-2);
	    }
	    c <<= 6;
	    c |= d & 0x3F;
	}

	/* assertion: c is a single UTF-4 value */
	if (c <= 0xFF) {
	    if (out >= outend)
		break;
	    *out++ = c;
	} else {
	    /* no chance for this in IsoLat1 */
	    *outlen = out - outstart;
	    *inlen = processed - instart;
	    return(-2);
	}
	processed = in;
    }
    *outlen = out - outstart;
    *inlen = processed - instart;
    return(*outlen);
}